

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool google::protobuf::internal::MergePartialFromImpl<false>(BoundedZCIS input,MessageLite *msg)

{
  char *ptr_00;
  EpsCopyInputStream *in_RDX;
  ParseContext ctx;
  char *ptr;
  undefined1 auStackY_98 [8];
  int *in_stack_ffffffffffffff70;
  ZeroCopyInputStream **in_stack_ffffffffffffff78;
  char **in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff8b;
  int in_stack_ffffffffffffff8c;
  ParseContext *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffd8;
  bool local_1;
  
  io::CodedInputStream::GetDefaultRecursionLimit();
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&,int&>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,(bool)in_stack_ffffffffffffff8b,
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  ptr_00 = (char *)(**(code **)(in_RDX->limit_end_ + 0x68))
                             (in_RDX,in_stack_ffffffffffffffd8,auStackY_98);
  if (ptr_00 == (char *)0x0) {
    local_1 = false;
  }
  else {
    EpsCopyInputStream::BackUp(in_RDX,ptr_00);
    local_1 = EpsCopyInputStream::EndedAtLimit((EpsCopyInputStream *)auStackY_98);
  }
  return local_1;
}

Assistant:

bool MergePartialFromImpl(BoundedZCIS input, MessageLite* msg) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input.zcis, input.limit);
  ptr = msg->_InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  return ctx.EndedAtLimit();
}